

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,double,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperator,bool,false,false>
               (interval_t *ldata,double *rdata,interval_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  interval_t left;
  interval_t left_00;
  bool bVar1;
  undefined8 *puVar2;
  unsigned_long in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  byte in_R9B;
  interval_t iVar3;
  double rentry_2;
  interval_t lentry_2;
  idx_t i;
  double rentry_1;
  interval_t lentry_1;
  idx_t start;
  double rentry;
  interval_t lentry;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  idx_t in_stack_fffffffffffffef0;
  interval_t in_stack_fffffffffffffef8;
  double in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  int64_t in_stack_ffffffffffffff20;
  ulong uVar4;
  undefined8 local_c8;
  int64_t local_c0;
  idx_t local_a0;
  unsigned_long local_98;
  undefined8 local_90;
  undefined8 local_88;
  interval_t local_80;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  unsigned_long local_58;
  unsigned_long local_50;
  ulong local_48;
  ulong local_40;
  unsigned_long local_38;
  byte local_29;
  TemplatedValidityMask<unsigned_long> *local_28;
  unsigned_long local_20;
  void *local_18;
  void *local_10;
  void *local_8;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  AssertRestrictFunction
            (in_RDI,(void *)((long)in_RDI + in_RCX * 0x10),in_RDX,
             (void *)((long)in_RDX + in_RCX * 0x10),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x4d);
  AssertRestrictFunction
            (local_10,(void *)((long)local_10 + local_20 * 8),local_18,
             (void *)((long)local_18 + local_20 * 0x10),
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x50);
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_28);
  if (bVar1) {
    for (uVar4 = 0; uVar4 < local_20; uVar4 = uVar4 + 1) {
      puVar2 = (undefined8 *)((long)local_8 + uVar4 * 0x10);
      iVar3.micros = uVar4;
      iVar3._0_8_ = puVar2[1];
      in_stack_fffffffffffffef8 =
           BinaryStandardOperatorWrapper::
           Operation<bool,duckdb::MultiplyOperator,duckdb::interval_t,double,duckdb::interval_t>
                     (SUB81((ulong)*puVar2 >> 0x38,0),iVar3,*(double *)((long)local_10 + uVar4 * 8),
                      (ValidityMask *)in_stack_fffffffffffffef8.micros,
                      in_stack_fffffffffffffef8._0_8_);
      puVar2 = (undefined8 *)((long)local_18 + uVar4 * 0x10);
      *puVar2 = in_stack_fffffffffffffef8._0_8_;
      puVar2[1] = in_stack_fffffffffffffef8.micros;
    }
  }
  else {
    local_38 = 0;
    local_40 = TemplatedValidityMask<unsigned_long>::EntryCount(0x1325879);
    for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
      local_50 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           (in_stack_fffffffffffffef8._0_8_,in_stack_fffffffffffffef0);
      local_58 = MinValue<unsigned_long>(local_38 + 0x40,local_20);
      bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_50);
      if (bVar1) {
        for (; local_38 < local_58; local_38 = local_38 + 1) {
          puVar2 = (undefined8 *)((long)local_8 + local_38 * 0x10);
          local_90 = *puVar2;
          local_88 = puVar2[1];
          local_70 = *(undefined8 *)((long)local_10 + local_38 * 8);
          left.micros = in_stack_ffffffffffffff20;
          left.months = (int)in_stack_ffffffffffffff18;
          left.days = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
          local_68 = local_90;
          local_60 = local_88;
          local_80 = BinaryStandardOperatorWrapper::
                     Operation<bool,duckdb::MultiplyOperator,duckdb::interval_t,double,duckdb::interval_t>
                               (SUB81((ulong)in_stack_ffffffffffffff10 >> 0x38,0),left,
                                in_stack_ffffffffffffff08,
                                (ValidityMask *)in_stack_fffffffffffffef8.micros,
                                in_stack_fffffffffffffef8._0_8_);
          puVar2 = (undefined8 *)((long)local_18 + local_38 * 0x10);
          *puVar2 = local_80._0_8_;
          puVar2[1] = local_80.micros;
        }
      }
      else {
        bVar1 = TemplatedValidityMask<unsigned_long>::NoneValid(local_50);
        if (bVar1) {
          local_38 = local_58;
        }
        else {
          local_98 = local_38;
          for (; local_38 < local_58; local_38 = local_38 + 1) {
            local_a0 = local_38 - local_98;
            bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(&local_50,&local_a0);
            if (bVar1) {
              left_00.micros = in_stack_ffffffffffffff20;
              left_00.months = (int)in_stack_ffffffffffffff18;
              left_00.days = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
              iVar3 = BinaryStandardOperatorWrapper::
                      Operation<bool,duckdb::MultiplyOperator,duckdb::interval_t,double,duckdb::interval_t>
                                (SUB81((ulong)in_stack_ffffffffffffff10 >> 0x38,0),left_00,
                                 in_stack_ffffffffffffff08,
                                 (ValidityMask *)in_stack_fffffffffffffef8.micros,
                                 in_stack_fffffffffffffef8._0_8_);
              puVar2 = (undefined8 *)((long)local_18 + local_38 * 0x10);
              local_c8 = iVar3._0_8_;
              *puVar2 = local_c8;
              local_c0 = iVar3.micros;
              puVar2[1] = local_c0;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}